

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O3

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructPackDecl_ObjectAPI
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          *array_lengths)

{
  FieldDef *pFVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  StructDef *struct_def_00;
  long *plVar5;
  pointer pFVar6;
  undefined8 *puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_type *psVar9;
  long *plVar10;
  ulong *puVar11;
  pointer pFVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  long lVar15;
  ulong uVar16;
  unsigned_long uVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FieldArrayLength tmp_array_length;
  vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
  array_only_lengths;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  value_type local_1b0;
  vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
  local_188;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  CSharpGenerator *local_f0;
  string local_e8;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  Type local_88;
  StructDef *local_60;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_f0 = this;
  local_60 = struct_def;
  if (local_58 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_1b0.name._M_dataplus._M_p = (pointer)&local_1b0.name.field_2;
      pFVar1 = *local_58;
      if ((pFVar1->value).type.base_type == BASE_TYPE_ARRAY) {
        local_88.base_type = (pFVar1->value).type.element;
        local_88.fixed_length = (pFVar1->value).type.fixed_length;
        local_88.element = BASE_TYPE_NONE;
        uVar3 = *(undefined4 *)&(pFVar1->value).type.struct_def;
        local_88.struct_def._4_4_ = *(undefined4 *)((long)&(pFVar1->value).type.struct_def + 4);
        uVar4 = *(undefined4 *)&(pFVar1->value).type.enum_def;
        local_88.enum_def._4_4_ = *(undefined4 *)((long)&(pFVar1->value).type.enum_def + 4);
        local_88.struct_def._0_2_ = (undefined2)uVar3;
        local_88.struct_def._2_2_ = (undefined2)((uint)uVar3 >> 0x10);
        local_88.enum_def._0_2_ = (undefined2)uVar4;
        local_88.enum_def._2_2_ = (undefined2)((uint)uVar4 >> 0x10);
      }
      else {
        local_88.base_type = (pFVar1->value).type.base_type;
        local_88.element = (pFVar1->value).type.element;
        uVar3 = *(undefined4 *)&(pFVar1->value).type.struct_def;
        local_88.struct_def._4_4_ = *(undefined4 *)((long)&(pFVar1->value).type.struct_def + 4);
        uVar13 = *(undefined8 *)((long)&(pFVar1->value).type.enum_def + 2);
        local_88.enum_def._0_2_ =
             (undefined2)
             ((ulong)*(undefined8 *)((long)&(pFVar1->value).type.struct_def + 2) >> 0x30);
        local_88.enum_def._2_2_ = (undefined2)uVar13;
        local_88.enum_def._4_4_ = (undefined4)((ulong)uVar13 >> 0x10);
        local_88.fixed_length = (uint16_t)((ulong)uVar13 >> 0x30);
        local_88.struct_def._0_2_ = (undefined2)uVar3;
        local_88.struct_def._2_2_ = (undefined2)((uint)uVar3 >> 0x10);
      }
      pcVar2 = (pFVar1->super_Definition).name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,pcVar2,
                 pcVar2 + (pFVar1->super_Definition).name._M_string_length);
      local_1b0.length = (int)local_88.fixed_length;
      std::
      vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
      ::push_back(array_lengths,&local_1b0);
      struct_def_00 =
           (StructDef *)
           CONCAT44(local_88.struct_def._4_4_,
                    CONCAT22(local_88.struct_def._2_2_,local_88.struct_def._0_2_));
      if (struct_def_00 == (StructDef *)0x0) {
        local_188.
        super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_188.
        super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_188.
        super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pFVar12 = (array_lengths->
                  super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pFVar6 = (array_lengths->
                 super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (pFVar6 != pFVar12) {
          lVar15 = 0;
          uVar16 = 0;
          do {
            if (0 < *(int *)((long)&pFVar12->length + lVar15)) {
              std::
              vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ::push_back(&local_188,
                          (value_type *)((long)&(pFVar12->name)._M_dataplus._M_p + lVar15));
              pFVar12 = (array_lengths->
                        super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              pFVar6 = (array_lengths->
                       super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            }
            uVar16 = uVar16 + 1;
            lVar15 = lVar15 + 0x28;
          } while (uVar16 < (ulong)(((long)pFVar6 - (long)pFVar12 >> 3) * -0x3333333333333333));
        }
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        local_110._M_string_length = 0;
        local_110.field_2._M_local_buf[0] = '\0';
        if (pFVar6 != pFVar12) {
          lVar15 = 0;
          uVar16 = 0;
          do {
            std::operator+(&local_210,"_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&(pFVar12->name)._M_dataplus._M_p + lVar15));
            std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_210._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1
                             );
            }
            uVar16 = uVar16 + 1;
            pFVar12 = (array_lengths->
                      super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar15 = lVar15 + 0x28;
          } while (uVar16 < (ulong)(((long)(array_lengths->
                                           super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pFVar12 >> 3) * -0x3333333333333333));
        }
        std::operator+(&local_1f0,"    var ",&local_110);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f0);
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_210.field_2._M_allocated_capacity = *psVar9;
          local_210.field_2._8_8_ = plVar5[3];
        }
        else {
          local_210.field_2._M_allocated_capacity = *psVar9;
          local_210._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_210._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_210._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if (local_188.
            super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_188.
            super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::__cxx11::string::append((char *)code_ptr);
          pFVar6 = (array_lengths->
                   super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((array_lengths->
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              )._M_impl.super__Vector_impl_data._M_finish != pFVar6) {
            lVar15 = 0;
            uVar16 = 0;
            do {
              ConvertCase(&local_1f0,(string *)((long)&(pFVar6->name)._M_dataplus._M_p + lVar15),
                          kUpperCamel,kSnake);
              plVar5 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_1f0,0,(char *)0x0,0x37c1d6);
              local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
              psVar9 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_210.field_2._M_allocated_capacity = *psVar9;
                local_210.field_2._8_8_ = plVar5[3];
              }
              else {
                local_210.field_2._M_allocated_capacity = *psVar9;
                local_210._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_210._M_string_length = plVar5[1];
              *plVar5 = (long)psVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_210._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._M_dataplus._M_p != &local_210.field_2) {
                operator_delete(local_210._M_dataplus._M_p,
                                local_210.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              uVar16 = uVar16 + 1;
              pFVar6 = (array_lengths->
                       super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              lVar15 = lVar15 + 0x28;
            } while (uVar16 < (ulong)(((long)(array_lengths->
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pFVar6 >> 3) * -0x3333333333333333));
          }
          std::__cxx11::string::append((char *)code_ptr);
        }
        else {
          GenTypeBasic_abi_cxx11_(&local_1d0,local_f0,&local_88,true);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x3644cb);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          psVar9 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_1f0.field_2._M_allocated_capacity = *psVar9;
            local_1f0.field_2._8_8_ = plVar5[3];
          }
          else {
            local_1f0.field_2._M_allocated_capacity = *psVar9;
            local_1f0._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_1f0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f0);
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          psVar9 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_210.field_2._M_allocated_capacity = *psVar9;
            local_210.field_2._8_8_ = plVar5[3];
          }
          else {
            local_210.field_2._M_allocated_capacity = *psVar9;
            local_210._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_210._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_210._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if (local_188.
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_188.
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar15 = 0;
            uVar16 = 0;
            do {
              pFVar6 = local_188.
                       super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (uVar16 != 0) {
                std::__cxx11::string::append((char *)code_ptr);
                pFVar6 = (pointer)((long)&((local_188.
                                            super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->name).
                                          _M_dataplus._M_p + lVar15);
              }
              NumToString<int>(&local_210,pFVar6->length);
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_210._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._M_dataplus._M_p != &local_210.field_2) {
                operator_delete(local_210._M_dataplus._M_p,
                                local_210.field_2._M_allocated_capacity + 1);
              }
              uVar16 = uVar16 + 1;
              lVar15 = lVar15 + 0x28;
            } while (uVar16 < (ulong)(((long)local_188.
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_188.
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x3333333333333333));
          }
          std::__cxx11::string::append((char *)code_ptr);
          std::__cxx11::string::append((char *)code_ptr);
          if (local_188.
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_188.
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar15 = 0x20;
            uVar17 = 0;
            do {
              NumToString<unsigned_long>(&local_1f0,uVar17);
              plVar5 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_1f0,0,(char *)0x0,0x3656c6);
              local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
              psVar9 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_210.field_2._M_allocated_capacity = *psVar9;
                local_210.field_2._8_8_ = plVar5[3];
              }
              else {
                local_210.field_2._M_allocated_capacity = *psVar9;
                local_210._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_210._M_string_length = plVar5[1];
              *plVar5 = (long)psVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_50,"for (var ",&local_210);
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
              local_170 = &local_160;
              plVar10 = plVar5 + 2;
              if ((long *)*plVar5 == plVar10) {
                local_160 = *plVar10;
                lStack_158 = plVar5[3];
              }
              else {
                local_160 = *plVar10;
                local_170 = (long *)*plVar5;
              }
              local_168 = plVar5[1];
              *plVar5 = (long)plVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_170,(ulong)local_210._M_dataplus._M_p);
              local_c8 = &local_b8;
              plVar10 = plVar5 + 2;
              if ((long *)*plVar5 == plVar10) {
                local_b8 = *plVar10;
                lStack_b0 = plVar5[3];
              }
              else {
                local_b8 = *plVar10;
                local_c8 = (long *)*plVar5;
              }
              local_c0 = plVar5[1];
              *plVar5 = (long)plVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
              local_130 = &local_120;
              puVar11 = (ulong *)(plVar5 + 2);
              if ((ulong *)*plVar5 == puVar11) {
                local_120 = *puVar11;
                lStack_118 = plVar5[3];
              }
              else {
                local_120 = *puVar11;
                local_130 = (ulong *)*plVar5;
              }
              local_128 = plVar5[1];
              *plVar5 = (long)puVar11;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              NumToString<int>(&local_e8,
                               *(int *)((long)&((local_188.
                                                 super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->name).
                                               _M_dataplus._M_p + lVar15));
              uVar16 = 0xf;
              if (local_130 != &local_120) {
                uVar16 = local_120;
              }
              if (uVar16 < local_e8._M_string_length + local_128) {
                uVar13 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  uVar13 = local_e8.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar13 < local_e8._M_string_length + local_128) goto LAB_001c1990;
                puVar7 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_e8,0,(char *)0x0,(ulong)local_130);
              }
              else {
LAB_001c1990:
                puVar7 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_130,(ulong)local_e8._M_dataplus._M_p);
              }
              local_150 = &local_140;
              plVar5 = puVar7 + 2;
              if ((long *)*puVar7 == plVar5) {
                local_140 = *plVar5;
                uStack_138 = puVar7[3];
              }
              else {
                local_140 = *plVar5;
                local_150 = (long *)*puVar7;
              }
              local_148 = puVar7[1];
              *puVar7 = plVar5;
              puVar7[1] = 0;
              *(undefined1 *)plVar5 = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
              local_a8 = &local_98;
              plVar10 = plVar5 + 2;
              if ((long *)*plVar5 == plVar10) {
                local_98 = *plVar10;
                lStack_90 = plVar5[3];
              }
              else {
                local_98 = *plVar10;
                local_a8 = (long *)*plVar5;
              }
              local_a0 = plVar5[1];
              *plVar5 = (long)plVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_a8,(ulong)local_210._M_dataplus._M_p);
              local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
              psVar9 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_1d0.field_2._M_allocated_capacity = *psVar9;
                local_1d0.field_2._8_8_ = plVar5[3];
              }
              else {
                local_1d0.field_2._M_allocated_capacity = *psVar9;
                local_1d0._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_1d0._M_string_length = plVar5[1];
              *plVar5 = (long)psVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d0);
              local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
              psVar9 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_1f0.field_2._M_allocated_capacity = *psVar9;
                local_1f0.field_2._8_8_ = plVar5[3];
              }
              else {
                local_1f0.field_2._M_allocated_capacity = *psVar9;
                local_1f0._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_1f0._M_string_length = plVar5[1];
              *plVar5 = (long)psVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1f0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p,
                                local_1d0.field_2._M_allocated_capacity + 1);
              }
              if (local_a8 != &local_98) {
                operator_delete(local_a8,local_98 + 1);
              }
              if (local_150 != &local_140) {
                operator_delete(local_150,local_140 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_130 != &local_120) {
                operator_delete(local_130,local_120 + 1);
              }
              if (local_c8 != &local_b8) {
                operator_delete(local_c8,local_b8 + 1);
              }
              if (local_170 != &local_160) {
                operator_delete(local_170,local_160 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._M_dataplus._M_p != &local_210.field_2) {
                operator_delete(local_210._M_dataplus._M_p,
                                local_210.field_2._M_allocated_capacity + 1);
              }
              uVar17 = uVar17 + 1;
              lVar15 = lVar15 + 0x28;
            } while (uVar17 < (ulong)(((long)local_188.
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_188.
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x3333333333333333));
            if (local_188.
                super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_188.
                super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar17 = 0;
              do {
                NumToString<unsigned_long>(&local_1f0,uVar17);
                plVar5 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_1f0,0,(char *)0x0,0x3656c6);
                local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
                psVar9 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar9) {
                  local_210.field_2._M_allocated_capacity = *psVar9;
                  local_210.field_2._8_8_ = plVar5[3];
                }
                else {
                  local_210.field_2._M_allocated_capacity = *psVar9;
                  local_210._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_210._M_string_length = plVar5[1];
                *plVar5 = (long)psVar9;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p,
                                  local_1f0.field_2._M_allocated_capacity + 1);
                }
                if (uVar17 == 0) {
                  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_1d0,local_110._M_dataplus._M_p,
                             local_110._M_dataplus._M_p + local_110._M_string_length);
                  std::__cxx11::string::append((char *)&local_1d0);
                  plVar5 = (long *)std::__cxx11::string::_M_append
                                             ((char *)&local_1d0,(ulong)local_210._M_dataplus._M_p);
                  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                  psVar9 = (size_type *)(plVar5 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar5 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar9) {
                    local_1f0.field_2._M_allocated_capacity = *psVar9;
                    local_1f0.field_2._8_8_ = plVar5[3];
                  }
                  else {
                    local_1f0.field_2._M_allocated_capacity = *psVar9;
                    local_1f0._M_dataplus._M_p = (pointer)*plVar5;
                  }
                  local_1f0._M_string_length = plVar5[1];
                  *plVar5 = (long)psVar9;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  std::__cxx11::string::_M_append
                            ((char *)code_ptr,(ulong)local_1f0._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                    operator_delete(local_1f0._M_dataplus._M_p,
                                    local_1f0.field_2._M_allocated_capacity + 1);
                  }
                  uVar13 = local_1d0.field_2._M_allocated_capacity;
                  _Var14._M_p = local_1d0._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) goto LAB_001c1e7e;
                }
                else {
                  std::operator+(&local_1f0,",",&local_210);
                  std::__cxx11::string::_M_append
                            ((char *)code_ptr,(ulong)local_1f0._M_dataplus._M_p);
                  uVar13 = local_1f0.field_2._M_allocated_capacity;
                  _Var14._M_p = local_1f0._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
LAB_001c1e7e:
                    operator_delete(_Var14._M_p,uVar13 + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_210._M_dataplus._M_p != &local_210.field_2) {
                  operator_delete(local_210._M_dataplus._M_p,
                                  local_210.field_2._M_allocated_capacity + 1);
                }
                uVar17 = uVar17 + 1;
              } while (uVar17 < (ulong)(((long)local_188.
                                               super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_188.
                                               super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                       -0x3333333333333333));
            }
          }
          std::__cxx11::string::append((char *)code_ptr);
          pFVar6 = (array_lengths->
                   super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((array_lengths->
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              )._M_impl.super__Vector_impl_data._M_finish != pFVar6) {
            lVar15 = 0;
            uVar17 = 0;
            uVar16 = 0;
            do {
              ConvertCase(&local_1f0,(string *)((long)&(pFVar6->name)._M_dataplus._M_p + lVar15),
                          kUpperCamel,kSnake);
              plVar5 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_1f0,0,(char *)0x0,0x37c1d6);
              local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
              psVar9 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_210.field_2._M_allocated_capacity = *psVar9;
                local_210.field_2._8_8_ = plVar5[3];
              }
              else {
                local_210.field_2._M_allocated_capacity = *psVar9;
                local_210._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_210._M_string_length = plVar5[1];
              *plVar5 = (long)psVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_210._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._M_dataplus._M_p != &local_210.field_2) {
                operator_delete(local_210._M_dataplus._M_p,
                                local_210.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              pFVar6 = (array_lengths->
                       super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if (0 < *(int *)((long)&pFVar6->length + lVar15)) {
                NumToString<unsigned_long>(&local_1d0,uVar17);
                plVar5 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_1d0,0,(char *)0x0,0x3656c5);
                local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                psVar9 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar9) {
                  local_1f0.field_2._M_allocated_capacity = *psVar9;
                  local_1f0.field_2._8_8_ = plVar5[3];
                }
                else {
                  local_1f0.field_2._M_allocated_capacity = *psVar9;
                  local_1f0._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_1f0._M_string_length = plVar5[1];
                *plVar5 = (long)psVar9;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f0);
                local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
                psVar9 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar9) {
                  local_210.field_2._M_allocated_capacity = *psVar9;
                  local_210.field_2._8_8_ = plVar5[3];
                }
                else {
                  local_210.field_2._M_allocated_capacity = *psVar9;
                  local_210._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_210._M_string_length = plVar5[1];
                *plVar5 = (long)psVar9;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_210._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_210._M_dataplus._M_p != &local_210.field_2) {
                  operator_delete(local_210._M_dataplus._M_p,
                                  local_210.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p,
                                  local_1f0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                  operator_delete(local_1d0._M_dataplus._M_p,
                                  local_1d0.field_2._M_allocated_capacity + 1);
                }
                uVar17 = uVar17 + 1;
                pFVar6 = (array_lengths->
                         super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                         )._M_impl.super__Vector_impl_data._M_start;
              }
              uVar16 = uVar16 + 1;
              lVar15 = lVar15 + 0x28;
            } while (uVar16 < (ulong)(((long)(array_lengths->
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pFVar6 >> 3) * -0x3333333333333333));
          }
          std::__cxx11::string::append((char *)code_ptr);
          if (local_188.
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_188.
              super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar16 = 0;
            do {
              std::__cxx11::string::append((char *)code_ptr);
              uVar16 = uVar16 + 1;
            } while (uVar16 < (ulong)(((long)local_188.
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_188.
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x3333333333333333));
          }
        }
        std::__cxx11::string::append((char *)code_ptr);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                   local_110.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
        ::~vector(&local_188);
      }
      else {
        GenStructPackDecl_ObjectAPI(local_f0,struct_def_00,code_ptr,array_lengths);
      }
      pFVar6 = (array_lengths->
               super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      (array_lengths->
      super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
      )._M_impl.super__Vector_impl_data._M_finish = pFVar6 + -1;
      pcVar2 = pFVar6[-1].name._M_dataplus._M_p;
      paVar8 = &pFVar6[-1].name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar8) {
        operator_delete(pcVar2,paVar8->_M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.name._M_dataplus._M_p != &local_1b0.name.field_2) {
        operator_delete(local_1b0.name._M_dataplus._M_p,
                        local_1b0.name.field_2._M_allocated_capacity + 1);
      }
      local_58 = local_58 + 1;
    } while (local_58 !=
             (local_60->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GenStructPackDecl_ObjectAPI(
      const StructDef &struct_def, std::string *code_ptr,
      std::vector<FieldArrayLength> &array_lengths) const {
    auto &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      auto is_array = IsArray(field.value.type);
      const auto &field_type =
          is_array ? field.value.type.VectorType() : field.value.type;
      FieldArrayLength tmp_array_length = {
        field.name,
        field_type.fixed_length,
      };
      array_lengths.push_back(tmp_array_length);
      if (field_type.struct_def != nullptr) {
        GenStructPackDecl_ObjectAPI(*field_type.struct_def, code_ptr,
                                    array_lengths);
      } else {
        std::vector<FieldArrayLength> array_only_lengths;
        for (size_t i = 0; i < array_lengths.size(); ++i) {
          if (array_lengths[i].length > 0) {
            array_only_lengths.push_back(array_lengths[i]);
          }
        }
        std::string name;
        for (size_t i = 0; i < array_lengths.size(); ++i) {
          name += "_" + array_lengths[i].name;
        }
        code += "    var " + name + " = ";
        if (array_only_lengths.size() > 0) {
          code += "new " + GenTypeBasic(field_type) + "[";
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            if (i != 0) { code += ","; }
            code += NumToString(array_only_lengths[i].length);
          }
          code += "];\n";
          code += "    ";
          // initialize array
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            auto idx = "idx" + NumToString(i);
            code += "for (var " + idx + " = 0; " + idx + " < " +
                    NumToString(array_only_lengths[i].length) + "; ++" + idx +
                    ") {";
          }
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            auto idx = "idx" + NumToString(i);
            if (i == 0) {
              code += name + "[" + idx;
            } else {
              code += "," + idx;
            }
          }
          code += "] = _o";
          for (size_t i = 0, j = 0; i < array_lengths.size(); ++i) {
            code += "." + ConvertCase(array_lengths[i].name, Case::kUpperCamel);
            if (array_lengths[i].length <= 0) continue;
            code += "[idx" + NumToString(j++) + "]";
          }
          code += ";";
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            code += "}";
          }
        } else {
          code += "_o";
          for (size_t i = 0; i < array_lengths.size(); ++i) {
            code += "." + ConvertCase(array_lengths[i].name, Case::kUpperCamel);
          }
          code += ";";
        }
        code += "\n";
      }
      array_lengths.pop_back();
    }
  }